

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_ChooseHighestPointsWait_TestShell::
~TEST_MinipointCounterTest_ChooseHighestPointsWait_TestShell
          (TEST_MinipointCounterTest_ChooseHighestPointsWait_TestShell *this)

{
  TEST_MinipointCounterTest_ChooseHighestPointsWait_TestShell *mem;
  TEST_MinipointCounterTest_ChooseHighestPointsWait_TestShell *this_local;
  
  mem = this;
  ~TEST_MinipointCounterTest_ChooseHighestPointsWait_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(MinipointCounterTest, ChooseHighestPointsWait)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::OneOfCircles, true);
	addSequence(Tile::OneOfBamboos, true);
	addSequence(Tile::ThreeOfCharacters, false);

	h.last_tile = Tile::ThreeOfCharacters;
	s.winByDiscard();
	CHECK_EQUAL(22, m.total(false));
}